

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O0

Node __thiscall verona::local_fq(verona *this,Node *node)

{
  bool bVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Node NVar3;
  shared_ptr<trieste::NodeDef> local_f0;
  undefined1 local_e0 [8];
  Lookup l;
  Token TStack_90;
  Token TStack_88;
  Token TStack_80;
  Token TStack_78;
  bool *local_70;
  undefined8 local_68;
  undefined1 local_60 [80];
  Node *node_local;
  
  local_60._72_8_ = node;
  node_local = (Node *)this;
  peVar2 = ::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)node);
  trieste::Token::Token((Token *)(local_60 + 0x10),(TokenDef *)Class);
  trieste::Token::Token((Token *)(local_60 + 0x18),(TokenDef *)TypeAlias);
  trieste::Token::Token((Token *)(local_60 + 0x20),(TokenDef *)TypeParam);
  trieste::Token::Token((Token *)(local_60 + 0x28),(TokenDef *)Trait);
  trieste::Token::Token((Token *)(local_60 + 0x30),(TokenDef *)Function);
  local_60._56_8_ = local_60 + 0x10;
  local_60._64_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x5;
  bVar1 = trieste::NodeDef::in(peVar2,(initializer_list<trieste::Token> *)(local_60 + 0x38));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    peVar2 = ::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)node);
    trieste::Token::Token((Token *)&l.too_many_typeargs,(TokenDef *)Class);
    trieste::Token::Token(&TStack_90,(TokenDef *)TypeAlias);
    trieste::Token::Token(&TStack_88,(TokenDef *)TypeParam);
    trieste::Token::Token(&TStack_80,(TokenDef *)Trait);
    trieste::Token::Token(&TStack_78,(TokenDef *)Function);
    local_70 = &l.too_many_typeargs;
    local_68 = 5;
    trieste::NodeDef::parent((NodeDef *)local_60,(initializer_list<trieste::Token> *)peVar2);
    ::std::shared_ptr<trieste::NodeDef>::operator=(node,(shared_ptr<trieste::NodeDef> *)local_60);
    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)local_60);
  }
  ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_f0,node);
  Lookup::Lookup((Lookup *)local_e0,&local_f0);
  ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_f0);
  make_fq((Lookup *)this,SUB81(local_e0,0));
  Lookup::~Lookup((Lookup *)local_e0);
  NVar3.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  NVar3.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Node)NVar3.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node local_fq(Node node)
  {
    // Build an FQType for the local type.
    if (!node->in({Class, TypeAlias, TypeParam, Trait, Function}))
      node = node->parent({Class, TypeAlias, TypeParam, Trait, Function});

    Lookup l(node);
    return make_fq(l, true);
  }